

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O3

FloatTextureHandle __thiscall
pbrt::FloatScaledTexture::Create
          (FloatScaledTexture *this,Transform *renderFromTexture,
          TextureParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined8 *puVar8;
  undefined8 *puVar9;
  float fVar10;
  FloatTextureHandle tex;
  Float cs;
  string ret;
  FloatTextureHandle scale;
  undefined1 local_68 [12];
  float local_5c;
  string local_58;
  undefined1 local_38 [16];
  ulong *puVar7;
  undefined4 extraout_var_00;
  
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"tex","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)local_68,(string *)parameters,1.0,
             (memory_resource *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"scale","");
  TextureParameterDictionary::GetFloatTexture
            ((TextureParameterDictionary *)local_38,(string *)parameters,1.0,
             (memory_resource *)&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  bVar2 = true;
  uVar3 = local_68._0_8_;
  uVar5 = local_38._0_8_;
  do {
    local_38._0_8_ = uVar5;
    local_68._0_8_ = uVar3;
    if ((float *)(local_38._0_8_ & 0xffffffffffff) != (float *)0x0 &&
        (local_38._0_8_ & 0xffff000000000000) == 0x5000000000000) {
      local_5c = *(float *)(local_38._0_8_ & 0xffffffffffff);
      if ((local_5c == 1.0) && (!NAN(local_5c))) {
        if (LOGGING_LogLevel < 1) {
          Log(Verbose,
              "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/textures.cpp"
              ,0x2c4,"Dropping useless scale by 1");
        }
        (this->tex).
        super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
        .bits = local_68._0_8_;
        return (FloatTextureHandle)
               (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                )this;
      }
      puVar9 = (undefined8 *)(local_68._0_8_ & 0xffffffffffff);
      if (puVar9 != (undefined8 *)0x0 && (local_68._0_8_ & 0xffff000000000000) == 0x1000000000000) {
        local_38._12_4_ = local_5c;
        iVar6 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,8);
        puVar8 = (undefined8 *)CONCAT44(extraout_var_00,iVar6);
        *puVar8 = 0;
        *puVar8 = *puVar9;
        uVar3 = puVar9[2];
        puVar8[1] = puVar9[1];
        puVar8[2] = uVar3;
        fVar10 = (float)local_38._12_4_;
        if (LOGGING_LogLevel < 1) {
          local_58._M_string_length = 0;
          local_58.field_2._M_local_buf[0] = '\0';
          local_58._M_dataplus._M_p = (pointer)paVar1;
          detail::stringPrintfRecursive<float&>
                    (&local_58,"Flattened scale %f * image texture",&local_5c);
          Log(Verbose,
              "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/textures.cpp"
              ,0x2ca,local_58._M_dataplus._M_p);
          fVar10 = local_5c;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != paVar1) {
            operator_delete(local_58._M_dataplus._M_p,
                            CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                     local_58.field_2._M_local_buf[0]) + 1);
            fVar10 = local_5c;
          }
        }
        *(float *)(puVar8 + 1) = fVar10 * *(float *)(puVar8 + 1);
        (this->tex).
        super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
        .bits = (ulong)puVar8 | 0x1000000000000;
        return (FloatTextureHandle)
               (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
                )this;
      }
    }
    bVar4 = !bVar2;
    bVar2 = false;
    uVar3 = local_38._0_8_;
    uVar5 = local_68._0_8_;
    if (bVar4) {
      iVar6 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x10,8);
      puVar7 = (ulong *)CONCAT44(extraout_var,iVar6);
      *puVar7 = local_68._0_8_;
      puVar7[1] = local_38._0_8_;
      (this->tex).
      super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
      .bits = (ulong)puVar7 | 0x4000000000000;
      return (FloatTextureHandle)
             (TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
              )this;
    }
  } while( true );
}

Assistant:

FloatTextureHandle FloatScaledTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    FloatTextureHandle tex = parameters.GetFloatTexture("tex", 1.f, alloc);
    FloatTextureHandle scale = parameters.GetFloatTexture("scale", 1.f, alloc);

    for (int i = 0; i < 2; ++i) {
        if (FloatConstantTexture *cscale = scale.CastOrNullptr<FloatConstantTexture>()) {
            Float cs = cscale->Evaluate({});
            if (cs == 1) {
                LOG_VERBOSE("Dropping useless scale by 1");
                return tex;
            } else if (FloatImageTexture *image =
                           tex.CastOrNullptr<FloatImageTexture>()) {
                FloatImageTexture *imageCopy =
                    alloc.new_object<FloatImageTexture>(*image);
                LOG_VERBOSE("Flattened scale %f * image texture", cs);
                imageCopy->MultiplyScale(cs);
                return imageCopy;
            }
#if defined(PBRT_BUILD_GPU_RENDERER)
            else if (GPUFloatImageTexture *gimage =
                         tex.CastOrNullptr<GPUFloatImageTexture>()) {
                GPUFloatImageTexture *gimageCopy =
                    alloc.new_object<GPUFloatImageTexture>(*gimage);
                LOG_VERBOSE("Flattened scale %f * gpu image texture", cs);
                gimageCopy->MultiplyScale(cs);
                return gimageCopy;
            }
#endif
        }
        std::swap(tex, scale);
    }

    std::swap(tex, scale);
    return alloc.new_object<FloatScaledTexture>(tex, scale);
}